

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

double benchmark_insert<eumorphic::collection<stack_container,A,B,C,D,CA,CB>>(size_t num_elems)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined1 auVar5 [16];
  anon_class_1_0_00000001 local_d351;
  double local_d350;
  anon_class_8_1_54a39806 local_d348;
  on_each<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nasosi[P]eumorphic_lib_eumorphic_include_eumorphic_hpp:86:29)_*>
  local_d340;
  basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
  local_d338;
  
  memset(&local_d338,0,0xd320);
  boost::hana::detail::
  basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_eumorphic::bounded_array<A,_250UL>,_eumorphic::bounded_array<B,_250UL>,_eumorphic::bounded_array<C,_250UL>,_eumorphic::bounded_array<D,_250UL>,_eumorphic::bounded_array<CA,_250UL>,_eumorphic::bounded_array<CB,_250UL>_>
  ::basic_tuple_impl(&local_d338);
  lVar2 = std::chrono::_V2::system_clock::now();
  if (4 < num_elems) {
    puVar3 = (undefined8 *)
             ((long)(local_d338.
                     super_ebo<boost::hana::detail::bti<3UL>,_eumorphic::bounded_array<D,_250UL>,_false>
                     .data_.super_array<D,_250UL>._M_elems +
                    local_d338.
                    super_ebo<boost::hana::detail::bti<3UL>,_eumorphic::bounded_array<D,_250UL>,_false>
                    .data_.size_) + 0x10);
    lVar4 = 0;
    do {
      uVar1 = local_d338.
              super_ebo<boost::hana::detail::bti<4UL>,_eumorphic::bounded_array<CA,_250UL>,_false>.
              data_.super_array<CA,_250UL>._M_elems +
              local_d338.
              super_ebo<boost::hana::detail::bti<4UL>,_eumorphic::bounded_array<CA,_250UL>,_false>.
              data_.size_;
      local_d338.
      super_ebo<boost::hana::detail::bti<4UL>,_eumorphic::bounded_array<CA,_250UL>,_false>.data_.
      size_ = local_d338.
              super_ebo<boost::hana::detail::bti<4UL>,_eumorphic::bounded_array<CA,_250UL>,_false>.
              data_.size_ + 1;
      *(undefined8 *)(uVar1 + 8) = 0x3ff0000000000000;
      uVar1 = local_d338.
              super_ebo<boost::hana::detail::bti<1UL>,_eumorphic::bounded_array<B,_250UL>,_false>.
              data_.super_array<B,_250UL>._M_elems +
              local_d338.
              super_ebo<boost::hana::detail::bti<1UL>,_eumorphic::bounded_array<B,_250UL>,_false>.
              data_.size_;
      local_d338.super_ebo<boost::hana::detail::bti<1UL>,_eumorphic::bounded_array<B,_250UL>,_false>
      .data_.size_ = local_d338.
                     super_ebo<boost::hana::detail::bti<1UL>,_eumorphic::bounded_array<B,_250UL>,_false>
                     .data_.size_ + 1;
      *(undefined8 *)(uVar1 + 8) = 0x3ff0000000000000;
      uVar1 = local_d338.
              super_ebo<boost::hana::detail::bti<0UL>,_eumorphic::bounded_array<A,_250UL>,_false>.
              data_.super_array<A,_250UL>._M_elems +
              local_d338.
              super_ebo<boost::hana::detail::bti<0UL>,_eumorphic::bounded_array<A,_250UL>,_false>.
              data_.size_;
      local_d338.super_ebo<boost::hana::detail::bti<0UL>,_eumorphic::bounded_array<A,_250UL>,_false>
      .data_.size_ = local_d338.
                     super_ebo<boost::hana::detail::bti<0UL>,_eumorphic::bounded_array<A,_250UL>,_false>
                     .data_.size_ + 1;
      *(undefined8 *)(uVar1 + 8) = 0x3ff0000000000000;
      uVar1 = local_d338.
              super_ebo<boost::hana::detail::bti<2UL>,_eumorphic::bounded_array<C,_250UL>,_false>.
              data_.super_array<C,_250UL>._M_elems +
              local_d338.
              super_ebo<boost::hana::detail::bti<2UL>,_eumorphic::bounded_array<C,_250UL>,_false>.
              data_.size_;
      local_d338.super_ebo<boost::hana::detail::bti<2UL>,_eumorphic::bounded_array<C,_250UL>,_false>
      .data_.size_ = local_d338.
                     super_ebo<boost::hana::detail::bti<2UL>,_eumorphic::bounded_array<C,_250UL>,_false>
                     .data_.size_ + 1;
      *(undefined8 *)(uVar1 + 8) = 0x3ff0000000000000;
      puVar3[-1] = 0x3ff0000000000000;
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3[2] = 0;
      puVar3[3] = 0;
      puVar3[4] = 0;
      lVar4 = lVar4 + -1;
      puVar3 = puVar3 + 7;
    } while (-lVar4 != num_elems / 5);
    local_d338.super_ebo<boost::hana::detail::bti<3UL>,_eumorphic::bounded_array<D,_250UL>,_false>.
    data_.size_ = local_d338.
                  super_ebo<boost::hana::detail::bti<3UL>,_eumorphic::bounded_array<D,_250UL>,_false>
                  .data_.size_ - lVar4;
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  local_d350 = (double)(lVar4 - lVar2) / 1000000000.0;
  lVar2 = local_d338.
          super_ebo<boost::hana::detail::bti<1UL>,_eumorphic::bounded_array<B,_250UL>,_false>.data_.
          size_ + local_d338.
                  super_ebo<boost::hana::detail::bti<0UL>,_eumorphic::bounded_array<A,_250UL>,_false>
                  .data_.size_ +
          local_d338.
          super_ebo<boost::hana::detail::bti<2UL>,_eumorphic::bounded_array<C,_250UL>,_false>.data_.
          size_ + local_d338.
                  super_ebo<boost::hana::detail::bti<3UL>,_eumorphic::bounded_array<D,_250UL>,_false>
                  .data_.size_ +
          local_d338.
          super_ebo<boost::hana::detail::bti<4UL>,_eumorphic::bounded_array<CA,_250UL>,_false>.data_
          .size_ + local_d338.
                   super_ebo<boost::hana::detail::bti<5UL>,_eumorphic::bounded_array<CB,_250UL>,_false>
                   .data_.size_;
  local_d348.f = &local_d351;
  local_d340.f = &local_d348;
  boost::hana::detail::
  on_each<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/nasosi[P]eumorphic/lib/eumorphic/include/eumorphic.hpp:86:29)_*>
  ::
  operator()<eumorphic::bounded_array<A,_250UL>_&,_eumorphic::bounded_array<B,_250UL>_&,_eumorphic::bounded_array<C,_250UL>_&,_eumorphic::bounded_array<D,_250UL>_&,_eumorphic::bounded_array<CA,_250UL>_&,_eumorphic::bounded_array<CB,_250UL>_&>
            (&local_d340,(bounded_array<A,_250UL> *)&local_d338,
             &local_d338.
              super_ebo<boost::hana::detail::bti<1UL>,_eumorphic::bounded_array<B,_250UL>,_false>.
              data_,&local_d338.
                     super_ebo<boost::hana::detail::bti<2UL>,_eumorphic::bounded_array<C,_250UL>,_false>
                     .data_,
             &local_d338.
              super_ebo<boost::hana::detail::bti<3UL>,_eumorphic::bounded_array<D,_250UL>,_false>.
              data_,&local_d338.
                     super_ebo<boost::hana::detail::bti<4UL>,_eumorphic::bounded_array<CA,_250UL>,_false>
                     .data_,
             &local_d338.
              super_ebo<boost::hana::detail::bti<5UL>,_eumorphic::bounded_array<CB,_250UL>,_false>.
              data_);
  auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar5._0_8_ = lVar2;
  auVar5._12_4_ = 0x45300000;
  return local_d350 /
         ((auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
}

Assistant:

double benchmark_insert( std::size_t num_elems)
{
	Cont container;

	//std::cout << "i";
	
	auto start = tic();
	{
                        for (size_t i = 0; i != num_elems/5; i++)
			{
				insert_default_value_of<CA>(container);
				insert_default_value_of<B>(container);
				insert_default_value_of<A>(container);
				insert_default_value_of<C>(container);
				insert_default_value_of<D>(container);
			}
	}
	double t = toc(start);
	double duration = t / container.size();
	do_not_optimize_out(container);

	return duration;
}